

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.cpp
# Opt level: O2

void __thiscall
atoiTest_testUint64OutOfBoundsNegative_Test::TestBody
          (atoiTest_testUint64OutOfBoundsNegative_Test *this)

{
  allocator local_29;
  string local_28;
  
  std::__cxx11::string::string
            ((string *)&local_28,"-1111111111111111111111111111111111111111111111111111111111111",
             &local_29);
  test<unsigned_long>(false,&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string
            ((string *)&local_28,"-1111111111111111111111111111111111111",&local_29);
  test<unsigned_long>(false,&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"-9223372036854775809",&local_29);
  test<unsigned_long>(false,&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"-9223372036854775808",&local_29);
  test<unsigned_long>(false,&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"-9223372036854775807",&local_29);
  test<unsigned_long>(false,&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"-10000",&local_29);
  test<unsigned_long>(false,&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"-10000",&local_29);
  test<unsigned_long>(false,&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"-1",&local_29);
  test<unsigned_long>(false,&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"-0",&local_29);
  test<unsigned_long>(false,&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  return;
}

Assistant:

TEST(atoiTest, testUint64OutOfBoundsNegative) {
  // out of bounds
  test<uint64_t>(false, "-1111111111111111111111111111111111111111111111111111111111111");
  test<uint64_t>(false, "-1111111111111111111111111111111111111");
  test<uint64_t>(false, "-9223372036854775809"); 
  test<uint64_t>(false, "-9223372036854775808");
  test<uint64_t>(false, "-9223372036854775807");
  test<uint64_t>(false, "-10000");
  test<uint64_t>(false, "-10000");
  test<uint64_t>(false, "-1");
  test<uint64_t>(false, "-0");
}